

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.h
# Opt level: O0

void __thiscall LTFlightData::FDKeyTy::FDKeyTy(FDKeyTy *this,FDKeyType _eType,string *_key,int base)

{
  string *in_RDX;
  undefined4 *in_RDI;
  string local_60 [4];
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  FDKeyType in_stack_ffffffffffffffb4;
  FDKeyTy *in_stack_ffffffffffffffb8;
  string local_40 [64];
  
  *in_RDI = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  *(undefined8 *)(in_RDI + 10) = 0;
  std::__cxx11::string::string(local_60,in_RDX);
  SetKey(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
         in_stack_ffffffffffffffa4);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

FDKeyTy(FDKeyType _eType, const std::string _key, int base=16)  { SetKey(_eType, _key, base); }